

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  pointer pcVar1;
  long *plVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  cmExecutionStatus status;
  char *accessString;
  char *currentListFile;
  string stack;
  cmListFileFunction newLFF;
  cmListFileArgument arg;
  ostringstream error;
  string local_2a0;
  cmMakefile *local_280;
  cmExecutionStatus local_274;
  char *local_270;
  char *local_268;
  char *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [72];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_1f0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  local_238._0_8_ = local_238 + 0x10;
  local_238._8_8_ = 0;
  local_238[0x10] = '\0';
  local_238._32_8_ = local_238 + 0x30;
  local_238._40_8_ = 0;
  local_238[0x30] = '\0';
  local_238._64_8_ = 0;
  vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_270 = newValue;
  local_268 = cmVariableWatch::GetAccessAsString(access_type);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  local_280 = mf;
  local_260 = cmMakefile::GetDefinition(mf,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LISTFILE_STACK","");
  pcVar6 = cmMakefile::GetProperty(local_280,(string *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,pcVar6,(allocator<char> *)&local_2a0);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar4 = vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Variable \"",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(variable->_M_dataplus)._M_p,variable->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" was accessed using ",0x15);
    pcVar6 = local_268;
    if (local_268 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
    }
    else {
      sVar8 = strlen(local_268);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with value \"",0xd);
    pcVar6 = "";
    if (local_270 != (char *)0x0) {
      pcVar6 = local_270;
    }
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(local_280,LOG,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,local_2a0._M_dataplus._M_p._0_4_) !=
        &local_2a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2a0._M_dataplus._M_p._4_4_,local_2a0._M_dataplus._M_p._0_4_),
                      local_2a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    if (vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      paVar9 = &((vStack_1f0.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
      do {
        plVar2 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar2) {
          operator_delete(plVar2,paVar9->_M_allocated_capacity + 1);
        }
        pcVar10 = (pointer)(paVar9 + 2);
        paVar9 = paVar9 + 3;
      } while (pcVar10 != pcVar4);
      vStack_1f0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_finish = pcVar3;
    }
    local_1a8._0_4_ = Quoted;
    local_2a0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_1f0,variable
               ,(Delimiter *)local_1a8,(int *)&local_2a0);
    local_1a8._0_4_ = 1;
    local_2a0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_1f0,
               &local_268,(Delimiter *)local_1a8,(int *)&local_2a0);
    local_1a8._0_8_ = "";
    if (local_270 != (char *)0x0) {
      local_1a8._0_8_ = local_270;
    }
    local_2a0._M_dataplus._M_p._0_4_ = 1;
    local_274.ReturnInvoked = true;
    local_274.BreakInvoked = true;
    local_274.ContinueInvoked = false;
    local_274.NestedError = false;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_1f0,
               (char **)local_1a8,(Delimiter *)&local_2a0,(int *)&local_274);
    local_1a8._0_4_ = Quoted;
    local_2a0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_1f0,
               &local_260,(Delimiter *)local_1a8,(int *)&local_2a0);
    local_1a8._0_4_ = 1;
    local_2a0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&vStack_1f0,
               &local_258,(Delimiter *)local_1a8,(int *)&local_2a0);
    cmCommandContext::cmCommandName::operator=
              ((cmCommandName *)local_238,(string *)((long)client_data + 8));
    local_238._64_8_ = 9999;
    local_274.ReturnInvoked = false;
    local_274.BreakInvoked = false;
    local_274.ContinueInvoked = false;
    local_274.NestedError = false;
    bVar5 = cmMakefile::ExecuteCommand(local_280,(cmListFileFunction *)local_238,&local_274);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error in cmake code at\nUnknown:0:\n",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"A command failed during the invocation of callback \"",0x34);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)((long)client_data + 8),
                          *(long *)((long)client_data + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,local_2a0._M_dataplus._M_p._0_4_) !=
          &local_2a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2a0._M_dataplus._M_p._4_4_,local_2a0._M_dataplus._M_p._0_4_),
                        local_2a0.field_2._M_allocated_capacity + 1);
      }
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_0029cef1;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_0029cef1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_1f0);
  if ((undefined1 *)local_238._32_8_ != local_238 + 0x30) {
    operator_delete((void *)local_238._32_8_,CONCAT71(local_238._49_7_,local_238[0x30]) + 1);
  }
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
  }
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.emplace_back(variable, cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(accessString, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(newValue ? newValue : "",
                                  cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(currentListFile, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(stack, cmListFileArgument::Quoted, 9999);
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(MessageType::LOG, msg.str());
  }

  data->InCallback = false;
}